

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O3

void pass2_no_dither(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize)

{
  int iVar1;
  int iVar2;
  hist3d ppahVar3;
  uchar *puVar4;
  int *piVar5;
  hist2d pahVar6;
  uchar uVar7;
  uint c0;
  my_cquantize_ptr cquantize_00;
  long lVar9;
  uint uVar10;
  uint c1;
  int in_R9D;
  int iVar11;
  long local_68;
  short sVar8;
  
  iVar1 = oim->sy;
  if (0 < (long)iVar1) {
    iVar2 = oim->sx;
    ppahVar3 = cquantize->histogram;
    local_68 = 0;
    do {
      if (0 < iVar2) {
        puVar4 = nim->pixels[local_68];
        piVar5 = oim->tpixels[local_68];
        lVar9 = 0;
        iVar11 = iVar2 + 1;
        do {
          uVar10 = piVar5[lVar9];
          if ((oim->transparent < 0) || (oim->transparent != uVar10)) {
            cquantize_00 = (my_cquantize_ptr)(ulong)(uVar10 >> 0x13 & 0x1f);
            c0 = uVar10 >> 10 & 0x3f;
            c1 = uVar10 >> 3 & 0x1f;
            uVar10 = c0 << 6;
            pahVar6 = ppahVar3[(long)cquantize_00];
            sVar8 = *(short *)((long)*pahVar6 + (ulong)c1 * 2 + (ulong)uVar10);
            if (sVar8 == 0) {
              fill_inverse_cmap(nim,(gdImagePtr)cquantize->histogram,cquantize_00,c0,c1,in_R9D);
              sVar8 = *(short *)((long)*pahVar6 + (ulong)c1 * 2 + (ulong)uVar10);
            }
            uVar7 = (char)sVar8 + 0xff;
          }
          else {
            uVar7 = (uchar)nim->colorsTotal;
          }
          puVar4[lVar9] = uVar7;
          lVar9 = lVar9 + 1;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
      }
      local_68 = local_68 + 1;
    } while (local_68 != iVar1);
  }
  return;
}

Assistant:

METHODDEF (void)
pass2_no_dither (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize)
{
	register int *inptr;
	register unsigned char *outptr;
	int width = oim->sx;
	int num_rows = oim->sy;
	hist3d histogram = cquantize->histogram;
	register int c0, c1, c2;
	int row;
	JDIMENSION col;
	register histptr cachep;


	for (row = 0; row < num_rows; row++) {
		inptr = input_buf[row];
		outptr = output_buf[row];
		for (col = width; col > 0; col--) {
			/* get pixel value and index into the cache */
			int r, g, b;
			r = gdTrueColorGetRed (*inptr);
			g = gdTrueColorGetGreen (*inptr);
			/*
			   2.0.24: inptr must not be incremented until after
			   transparency check, if any. Thanks to "Super Pikeman."
			 */
			b = gdTrueColorGetBlue (*inptr);

			/* If the pixel is transparent, we assign it the palette index that
			 * will later be added at the end of the palette as the transparent
			 * index. */
			if ((oim->transparent >= 0) && (oim->transparent == *inptr)) {
				*outptr++ = nim->colorsTotal;
				inptr++;
				continue;
			}
			inptr++;
			c0 = r >> C0_SHIFT;
			c1 = g >> C1_SHIFT;
			c2 = b >> C2_SHIFT;
			cachep = &histogram[c0][c1][c2];
			/* If we have not seen this color before, find nearest colormap entry */
			/* and update the cache */
			if (*cachep == 0)
				fill_inverse_cmap (oim, nim, cquantize, c0, c1, c2);
			/* Now emit the colormap index for this cell */
			*outptr++ = (*cachep - 1);
		}
	}
}